

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O3

void aes_ctr_xor(aes_context *context,uint8_t *iv,uint64_t block,uint8_t *buffer,size_t size)

{
  char *pcVar1;
  int i;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  uint8_t *puVar5;
  bool bVar6;
  uint8_t counter [16];
  uint8_t tmp [16];
  undefined8 local_58;
  undefined8 uStack_50;
  byte local_48 [24];
  
  local_58 = *(undefined8 *)iv;
  uStack_50 = *(undefined8 *)(iv + 8);
  lVar2 = 0xf;
  do {
    uVar4 = *(byte *)((long)&local_58 + lVar2) + block;
    *(char *)((long)&local_58 + lVar2) = (char)uVar4;
    block = uVar4 >> 8;
    bVar6 = lVar2 != 0;
    lVar2 = lVar2 + -1;
  } while (bVar6);
  if (0xf < size) {
    do {
      puVar5 = buffer;
      aes_encrypt(context,(uint8_t *)&local_58,local_48);
      lVar2 = 0;
      do {
        puVar5[lVar2] = puVar5[lVar2] ^ local_48[lVar2];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x10);
      uVar3 = 0xf;
      do {
        uVar4 = (ulong)uVar3;
        bVar6 = uVar3 != 0;
        uVar3 = uVar3 - 1;
        pcVar1 = (char *)((long)&local_58 + uVar4);
        *pcVar1 = *pcVar1 + '\x01';
        if (*pcVar1 != '\0') break;
      } while (bVar6);
      size = size - 0x10;
      buffer = puVar5 + 0x10;
    } while (0xf < size);
    buffer = puVar5 + 0x10;
  }
  if (size != 0) {
    aes_encrypt(context,(uint8_t *)&local_58,local_48);
    uVar4 = 0;
    do {
      buffer[uVar4] = buffer[uVar4] ^ local_48[uVar4];
      uVar4 = uVar4 + 1;
    } while (size != uVar4);
  }
  return;
}

Assistant:

void aes_ctr_xor(const aes_context* context, const uint8_t* iv, uint64_t block, uint8_t* buffer, size_t size)
{
    uint8_t tmp[16];
    uint8_t counter[16];
    for (uint32_t i=0; i<16; i++)
    {
        counter[i] = iv[i];
    }
    ctr_add(counter, block);

#if PLATFORM_SUPPORTS_AESNI
    if (aes_supported_x86())
    {
        aes_ctr_xor_x86(context, counter, buffer, size);
        return;
    }
#endif

    while (size >= 16)
    {
        aes_encrypt(context, counter, tmp);
        for (uint32_t i=0; i<16; i++)
        {
            *buffer++ ^= tmp[i];
        }
        for (int i=15; i>=0; i--)
            if (++counter[i] != 0)
                break;
        size -= 16;
    }

    if (size != 0)
    {
        aes_encrypt(context, counter, tmp);
        for (size_t i=0; i<size; i++)
        {
            *buffer++ ^= tmp[i];
        }
    }
}